

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::removeMember(Value *this,char *begin,char *end,Value *removed)

{
  iterator __position;
  bool bVar1;
  CZString actualKey;
  key_type local_30;
  
  if (*(char *)&this->bits_ == '\a') {
    local_30.field_1.index_ = ((int)end - (int)begin) * 4;
    local_30.cstr_ = begin;
    __position = std::
                 _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 ::find(&((this->value_).map_)->_M_t,&local_30);
    bVar1 = (_Rb_tree_header *)__position._M_node !=
            &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header;
    if (bVar1) {
      if (removed != (Value *)0x0) {
        swap((Value *)&__position._M_node[1]._M_left,removed);
      }
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::_M_erase_aux(&((this->value_).map_)->_M_t,(const_iterator)__position._M_node);
    }
    if ((local_30.cstr_ != (char *)0x0) && ((local_30.field_1.index_ & 3) == 1)) {
      free(local_30.cstr_);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Value::removeMember(const char* begin, const char* end, Value* removed) {
  if (type() != objectValue) {
    return false;
  }
  CZString actualKey(begin, static_cast<unsigned>(end - begin),
                     CZString::noDuplication);
  auto it = value_.map_->find(actualKey);
  if (it == value_.map_->end())
    return false;
  if (removed)
    *removed = std::move(it->second);
  value_.map_->erase(it);
  return true;
}